

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::writeWithFds
          (AsyncPipe *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  size_t sVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  AsyncCapabilityStream *pAVar3;
  ArrayPtr<const_unsigned_char> *in_R9;
  bool bVar4;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s339;
  Fault local_90;
  Fault f;
  size_t local_80;
  DebugExpression<unsigned_long> local_78;
  undefined1 local_70 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ArrayPtr<const_unsigned_char> *local_40;
  AsyncPipe *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_local;
  ArrayPtr<const_unsigned_char> data_local;
  
  this_local = (AsyncPipe *)moreData.size_;
  data_local.ptr = (uchar *)moreData.ptr;
  moreData_local.size_ = data.size_;
  moreData_local.ptr = in_R9;
  while( true ) {
    sVar1 = ArrayPtr<const_unsigned_char>::size
                      ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
    bVar4 = false;
    if (sVar1 == 0) {
      sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
      bVar4 = sVar1 != 0;
    }
    if (!bVar4) break;
    pAVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::front
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    moreData_local.size_ = (size_t)pAVar2->ptr;
    data_local.ptr = (uchar *)pAVar2->size_;
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    join_0x00000010_0x00000000_ =
         ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                   ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,sVar1);
    this_local = (AsyncPipe *)_kjCondition._32_8_;
    moreData_local.ptr = local_40;
  }
  sVar1 = ArrayPtr<const_unsigned_char>::size
                    ((ArrayPtr<const_unsigned_char> *)&moreData_local.size_);
  if (sVar1 == 0) {
    local_80 = ArrayPtr<const_int>::size(&fds);
    local_78 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_80);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_70,&local_78,
               (int *)((long)&f.exception + 4));
    bVar4 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_70);
    if (!bVar4) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[34]>
                (&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x151,FAILED,"fds.size() == 0",
                 "_kjCondition,\"can\'t attach FDs to empty message\"",
                 (DebugComparison<unsigned_long,_int> *)local_70,
                 (char (*) [34])"can\'t attach FDs to empty message");
      kj::_::Debug::Fault::fatal(&local_90);
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    pAVar3 = kj::_::readMaybe<kj::AsyncCapabilityStream>(&((AsyncPipe *)data.ptr)->state);
    if (pAVar3 == (AsyncCapabilityStream *)0x0) {
      newAdaptedPromise<void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite,kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char_const>&,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&,kj::ArrayPtr<int_const>&>
                ((kj *)this,(AsyncPipe *)data.ptr,
                 (ArrayPtr<const_unsigned_char> *)&moreData_local.size_,
                 (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,&fds);
    }
    else {
      (*(pAVar3->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0xe])
                (this,pAVar3,moreData_local.size_,data_local.ptr,this_local,moreData_local.ptr,
                 fds.ptr,fds.size_);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                             ArrayPtr<const ArrayPtr<const byte>> moreData,
                             ArrayPtr<const int> fds) override {
    while (data.size() == 0 && moreData.size() > 0) {
      data = moreData.front();
      moreData = moreData.slice(1, moreData.size());
    }

    if (data.size() == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't attach FDs to empty message");
      return READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.writeWithFds(data, moreData, fds);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(*this, data, moreData, fds);
    }
  }